

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall xLearn::FFMParser::~FFMParser(FFMParser *this)

{
  Parser::~Parser(&this->super_Parser);
  operator_delete(this);
  return;
}

Assistant:

~FFMParser() {  }